

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
findBucketWithHash<QStringView>
          (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *this,
          QStringView *key,size_t hash)

{
  ulong uVar1;
  Span *pSVar2;
  long lVar3;
  QStringView rhs;
  byte bVar4;
  bool bVar5;
  Span *pSVar6;
  Span *pSVar7;
  ulong uVar8;
  Bucket BVar9;
  QStringView lhs;
  
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  uVar8 = uVar1 - 1 & hash;
  pSVar6 = pSVar2 + (uVar8 >> 7);
  uVar8 = (ulong)((uint)uVar8 & 0x7f);
  bVar4 = pSVar6->offsets[uVar8];
  if (bVar4 != 0xff) {
    lVar3 = key->m_size;
    rhs = *key;
    do {
      if ((*(long *)pSVar6->entries[bVar4].storage.data == lVar3) &&
         (lhs.m_data = *(storage_type_conflict **)(pSVar6->entries[bVar4].storage.data + 8),
         lhs.m_size = lVar3, bVar5 = QtPrivate::equalStrings(lhs,rhs), bVar5)) break;
      uVar8 = uVar8 + 1;
      if (uVar8 == 0x80) {
        pSVar7 = pSVar6 + 1;
        pSVar6 = pSVar2;
        if (((long)pSVar7 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - (uVar1 >> 7) != 0) {
          pSVar6 = pSVar7;
        }
        uVar8 = 0;
      }
      bVar4 = pSVar6->offsets[uVar8];
    } while (bVar4 != 0xff);
  }
  BVar9.index = uVar8;
  BVar9.span = pSVar6;
  return BVar9;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }